

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<TestHoge::STATE,TestHoge::STATE>
          (string *__return_storage_ptr__,internal *this,STATE *value,STATE *param_2)

{
  STATE *param_1_local;
  STATE *value_local;
  
  PrintToString<TestHoge::STATE>(__return_storage_ptr__,(STATE *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}